

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_tar_filenames.c
# Opt level: O0

void test_tar_filenames(void)

{
  int local_10;
  int local_c;
  int flen;
  int dlen;
  
  for (local_c = 0x2d; local_c < 0x37; local_c = local_c + 1) {
    for (local_10 = 0x2d; local_10 < 0x37; local_10 = local_10 + 1) {
      test_filename((char *)0x0,local_c,local_10);
      test_filename("/",local_c,local_10);
    }
  }
  for (local_c = 0; local_c < 0x8c; local_c = local_c + 10) {
    for (local_10 = 0x62; local_10 < 0x66; local_10 = local_10 + 1) {
      test_filename((char *)0x0,local_c,local_10);
      test_filename("/",local_c,local_10);
    }
  }
  for (local_c = 0x8c; local_c < 0xa0; local_c = local_c + 1) {
    for (local_10 = 0x5f; local_10 < 0x69; local_10 = local_10 + 1) {
      test_filename((char *)0x0,local_c,local_10);
      test_filename("/",local_c,local_10);
    }
  }
  return;
}

Assistant:

DEFINE_TEST(test_tar_filenames)
{
	int dlen, flen;

	/* Repeat the following for a variety of dir/file lengths. */
	for (dlen = 45; dlen < 55; dlen++) {
		for (flen = 45; flen < 55; flen++) {
			test_filename(NULL, dlen, flen);
			test_filename("/", dlen, flen);
		}
	}

	for (dlen = 0; dlen < 140; dlen += 10) {
		for (flen = 98; flen < 102; flen++) {
			test_filename(NULL, dlen, flen);
			test_filename("/", dlen, flen);
		}
	}

	for (dlen = 140; dlen < 160; dlen++) {
		for (flen = 95; flen < 105; flen++) {
			test_filename(NULL, dlen, flen);
			test_filename("/", dlen, flen);
		}
	}
}